

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O0

double __thiscall
HighsLinearSumBounds::getResidualSumLowerOrig
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  double dVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  int in_EDX;
  int in_ESI;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_RDI;
  double in_XMM0_Qa;
  double in_stack_ffffffffffffff98;
  HighsCDouble *in_stack_ffffffffffffffa0;
  double local_58;
  HighsCDouble local_40;
  HighsCDouble local_30;
  double local_20;
  int local_18;
  int local_14;
  double local_8;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_EDX;
  local_14 = in_ESI;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)in_ESI);
  if (*pvVar2 == 0) {
    if (local_20 <= 0.0) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI,(long)local_14);
      local_40 = HighsCDouble::operator-(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_8 = HighsCDouble::operator_cast_to_double(&local_40);
    }
    else {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI,(long)local_14);
      local_30 = HighsCDouble::operator-(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_8 = HighsCDouble::operator_cast_to_double(&local_30);
    }
  }
  else if (*pvVar2 == 1) {
    if (local_20 <= 0.0) {
      dVar1 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_finish)->hi)[local_18];
      if ((dVar1 != INFINITY) || (NAN(dVar1))) {
        local_8 = -INFINITY;
      }
      else {
        pvVar3 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                           (in_RDI,(long)local_14);
        local_8 = HighsCDouble::operator_cast_to_double(pvVar3);
      }
    }
    else {
      dVar1 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start)->hi)[local_18];
      if ((dVar1 != -INFINITY) || (NAN(dVar1))) {
        local_58 = -INFINITY;
      }
      else {
        pvVar3 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                           (in_RDI,(long)local_14);
        local_58 = HighsCDouble::operator_cast_to_double(pvVar3);
      }
      local_8 = local_58;
    }
  }
  else {
    local_8 = -INFINITY;
  }
  return local_8;
}

Assistant:

double HighsLinearSumBounds::getResidualSumLowerOrig(HighsInt sum, HighsInt var,
                                                     double coefficient) const {
  switch (numInfSumLowerOrig[sum]) {
    case 0:
      if (coefficient > 0)
        return double(sumLowerOrig[sum] - varLower[var] * coefficient);
      else
        return double(sumLowerOrig[sum] - varUpper[var] * coefficient);
      break;
    case 1:
      if (coefficient > 0)
        return varLower[var] == -kHighsInf ? double(sumLowerOrig[sum])
                                           : -kHighsInf;
      else
        return varUpper[var] == kHighsInf ? double(sumLowerOrig[sum])
                                          : -kHighsInf;
      break;
    default:
      return -kHighsInf;
  }
}